

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O2

void __thiscall adios2::transport::FileStdio::CheckFile(FileStdio *this,string *hint)

{
  int iVar1;
  int *piVar2;
  allocator local_eb;
  allocator local_ea;
  allocator local_e9;
  string errmsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if ((FILE *)this->m_File == (FILE *)0x0) {
    errmsg._M_dataplus._M_p = (pointer)&errmsg.field_2;
    errmsg._M_string_length = 0;
    errmsg.field_2._M_local_buf[0] = '\0';
    piVar2 = __errno_location();
    if (*piVar2 != 0) {
      strerror(*piVar2);
      std::__cxx11::string::assign((char *)&errmsg);
    }
    std::__cxx11::string::string((string *)&local_88,"Toolkit",&local_e9);
    std::__cxx11::string::string((string *)&local_a8,"transport::file::FileStdio",&local_ea);
    std::__cxx11::string::string((string *)&local_c8,"CheckFile",&local_eb);
    std::operator+(&local_68,"ERROR: ",hint);
    std::operator+(&local_48,&local_68,":");
    std::operator+(&local_28,&local_48,&errmsg);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_88,&local_a8,&local_c8,&local_28,-1);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    iVar1 = ferror((FILE *)this->m_File);
    if (iVar1 == 0) {
      return;
    }
    std::__cxx11::string::string((string *)&errmsg,"Toolkit",(allocator *)&local_28);
    std::__cxx11::string::string
              ((string *)&local_88,"transport::file::FileStdio",(allocator *)&local_48);
    std::__cxx11::string::string((string *)&local_a8,"CheckFile",(allocator *)&local_68);
    std::operator+(&local_c8,"ERROR: ",hint);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&errmsg,&local_88,&local_a8,&local_c8,-1);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&errmsg);
  return;
}

Assistant:

void FileStdio::CheckFile(const std::string hint) const
{
    if (!m_File)
    {
        std::string errmsg;
        if (errno)
        {
            errmsg = std::strerror(errno);
        }
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "CheckFile",
                                              "ERROR: " + hint + ":" + errmsg);
    }
    else if (std::ferror(m_File))
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "CheckFile",
                                              "ERROR: " + hint);
    }
}